

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QExpression.hpp
# Opt level: O0

void __thiscall Qentem::QExpression::operator+=(QExpression *this,QExpression *right)

{
  ExpressionType EVar1;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  QExpression *right_local;
  QExpression *this_local;
  
  EVar1 = this->Type;
  if (EVar1 == RealNumber) {
    EVar1 = right->Type;
    if (EVar1 == RealNumber) {
      *(double *)&this->field_0 = *(double *)&right->field_0 + *(double *)&this->field_0;
    }
    else if (EVar1 == NaturalNumber) {
      auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,(right->field_0).SubExpressions.storage_);
      *(double *)&this->field_0 = auVar2._0_8_ + *(double *)&this->field_0;
    }
    else if (EVar1 == IntegerNumber) {
      *(double *)&this->field_0 =
           (double)(long)(right->field_0).SubExpressions.storage_ + *(double *)&this->field_0;
    }
  }
  else if (EVar1 == NaturalNumber) {
    EVar1 = right->Type;
    if (EVar1 == RealNumber) {
      auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,(this->field_0).SubExpressions.storage_);
      *(double *)&this->field_0 = auVar2._0_8_ + *(double *)&right->field_0;
      this->Type = RealNumber;
    }
    else if (EVar1 == NaturalNumber) {
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((long)&((this->field_0).SubExpressions.storage_)->field_0 +
           (long)&((right->field_0).SubExpressions.storage_)->field_0);
    }
    else if (EVar1 == IntegerNumber) {
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((long)&((this->field_0).SubExpressions.storage_)->field_0 +
           (long)&((right->field_0).SubExpressions.storage_)->field_0);
      this->Type = IntegerNumber;
    }
  }
  else if (EVar1 == IntegerNumber) {
    EVar1 = right->Type;
    if (EVar1 == RealNumber) {
      *(double *)&this->field_0 =
           (double)(long)(this->field_0).SubExpressions.storage_ + *(double *)&right->field_0;
      this->Type = RealNumber;
    }
    else if (EVar1 == NaturalNumber || EVar1 == IntegerNumber) {
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((long)&((this->field_0).SubExpressions.storage_)->field_0 +
           (long)&((right->field_0).SubExpressions.storage_)->field_0);
    }
  }
  return;
}

Assistant:

void operator+=(const QExpression &right) noexcept {
        switch (Type) {
            case ExpressionType::NaturalNumber: {
                switch (right.Type) {
                    case ExpressionType::NaturalNumber: {
                        Value.Number.Natural += right.Value.Number.Natural;
                        break;
                    }

                    case ExpressionType::IntegerNumber: {
                        Value.Number.Integer += right.Value.Number.Integer;
                        Type = ExpressionType::IntegerNumber;
                        break;
                    }

                    case ExpressionType::RealNumber: {
                        Value.Number.Real = (double(Value.Number.Natural) + right.Value.Number.Real);
                        Type              = ExpressionType::RealNumber;
                        break;
                    }

                    default: {
                    }
                }

                break;
            }

            case ExpressionType::IntegerNumber: {
                switch (right.Type) {
                    case ExpressionType::NaturalNumber:
                    case ExpressionType::IntegerNumber: {
                        Value.Number.Integer += right.Value.Number.Integer;
                        break;
                    }

                    case ExpressionType::RealNumber: {
                        Value.Number.Real = (double(Value.Number.Integer) + right.Value.Number.Real);
                        Type              = ExpressionType::RealNumber;
                        break;
                    }

                    default: {
                    }
                }

                break;
            }

            case ExpressionType::RealNumber: {
                switch (right.Type) {
                    case ExpressionType::NaturalNumber: {
                        Value.Number.Real += double(right.Value.Number.Natural);
                        break;
                    }

                    case ExpressionType::IntegerNumber: {
                        Value.Number.Real += double(right.Value.Number.Integer);
                        break;
                    }

                    case ExpressionType::RealNumber: {
                        Value.Number.Real += right.Value.Number.Real;
                        break;
                    }

                    default: {
                    }
                }
            }

            default: {
            }
        }
    }